

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Id __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::makeSmearedConstant
          (TGlslangToSpvTraverser *this,Id constant,int vectorSize)

{
  Instruction *pIVar1;
  Id IVar2;
  int iVar3;
  bool bVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> components;
  Id local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  if (vectorSize != 0) {
    pIVar1 = (this->builder).module.idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[constant];
    IVar2 = 0;
    if (pIVar1 != (Instruction *)0x0) {
      IVar2 = pIVar1->typeId;
    }
    local_4c = constant;
    IVar2 = spv::Builder::makeVectorType(&this->builder,IVar2,vectorSize);
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3 = 0;
    if (0 < vectorSize) {
      iVar3 = vectorSize;
    }
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
    }
    constant = spv::Builder::makeCompositeConstant
                         (&this->builder,IVar2,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,false);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  }
  return constant;
}

Assistant:

spv::Id TGlslangToSpvTraverser::makeSmearedConstant(spv::Id constant, int vectorSize)
{
    if (vectorSize == 0)
        return constant;

    spv::Id vectorTypeId = builder.makeVectorType(builder.getTypeId(constant), vectorSize);
    std::vector<spv::Id> components;
    for (int c = 0; c < vectorSize; ++c)
        components.push_back(constant);
    return builder.makeCompositeConstant(vectorTypeId, components);
}